

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

FState * FindState(int statenum)

{
  uint uVar1;
  StateMapper *pSVar2;
  uint local_1c;
  int local_18;
  uint i;
  int stateacc;
  int statenum_local;
  
  if (statenum != 0) {
    local_18 = 1;
    for (local_1c = 0; uVar1 = TArray<StateMapper,_StateMapper>::Size(&StateMap), local_1c < uVar1;
        local_1c = local_1c + 1) {
      if ((local_18 <= statenum) &&
         (pSVar2 = TArray<StateMapper,_StateMapper>::operator[](&StateMap,(ulong)local_1c),
         statenum < local_18 + pSVar2->StateSpan)) {
        pSVar2 = TArray<StateMapper,_StateMapper>::operator[](&StateMap,(ulong)local_1c);
        if (pSVar2->State == (FState *)0x0) {
          return (FState *)0x0;
        }
        pSVar2 = TArray<StateMapper,_StateMapper>::operator[](&StateMap,(ulong)local_1c);
        if ((pSVar2->OwnerIsPickup & 1U) != 0) {
          pSVar2 = TArray<StateMapper,_StateMapper>::operator[](&StateMap,(ulong)local_1c);
          PushTouchedActor(pSVar2->Owner);
        }
        pSVar2 = TArray<StateMapper,_StateMapper>::operator[](&StateMap,(ulong)local_1c);
        return pSVar2->State + ((long)statenum - (long)local_18);
      }
      pSVar2 = TArray<StateMapper,_StateMapper>::operator[](&StateMap,(ulong)local_1c);
      local_18 = pSVar2->StateSpan + local_18;
    }
  }
  return (FState *)0x0;
}

Assistant:

static FState *FindState (int statenum)
{
	int stateacc;
	unsigned i;

	if (statenum == 0)
		return NULL;

	for (i = 0, stateacc = 1; i < StateMap.Size(); i++)
	{
		if (stateacc <= statenum && stateacc + StateMap[i].StateSpan > statenum)
		{
			if (StateMap[i].State != NULL)
			{
				if (StateMap[i].OwnerIsPickup)
				{
					PushTouchedActor(StateMap[i].Owner);
				}
				return StateMap[i].State + statenum - stateacc;
			}
			else return NULL;
		}
		stateacc += StateMap[i].StateSpan;
	}
	return NULL;
}